

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O1

Stream * rw::d3d9::readNativeData
                   (Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  short *psVar1;
  uint uVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  undefined4 *puVar6;
  uint *puVar7;
  uint *puVar8;
  void *pvVar9;
  uint16 *puVar10;
  uint8 *puVar11;
  int iVar12;
  uint *puVar13;
  int *piVar14;
  ulong uVar15;
  long lVar16;
  VertexElement elements [12];
  short local_98 [52];
  
  bVar3 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar3) {
    uVar4 = Stream::readU32(stream);
    if (uVar4 == 9) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d9.cpp line: 164"
      ;
      puVar6 = (undefined4 *)(*DAT_00149de8)(0x70,0x3000f);
      *(undefined4 **)((long)object + 0x98) = puVar6;
      *puVar6 = 9;
      uVar5 = Stream::readI32(stream);
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d9.cpp line: 169"
      ;
      puVar7 = (uint *)(*DAT_00149de8)((long)(int)uVar5,0x1000f);
      (*stream->_vptr_Stream[4])(stream,puVar7,(ulong)uVar5);
      puVar6[1] = *puVar7;
      uVar5 = puVar7[1];
      puVar6[2] = uVar5;
      *(undefined8 *)(puVar6 + 4) = 0;
      puVar6[6] = puVar7[3];
      puVar6[0x14] = puVar7[0xc];
      *(undefined8 *)(puVar6 + 0x16) = 0;
      puVar6[0x18] = puVar7[0xe];
      puVar6[0x19] = puVar7[0xf];
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d9.cpp line: 181"
      ;
      puVar8 = (uint *)(*DAT_00149de8)((ulong)uVar5 * 0x30,0x3000f);
      *(uint **)(puVar6 + 0x1a) = puVar8;
      iVar12 = puVar6[2];
      if (iVar12 != 0) {
        puVar13 = puVar7 + 0x10;
        lVar16 = *(long *)((long)object + 0x80);
        do {
          *puVar8 = *puVar13;
          puVar8[1] = puVar13[1];
          *(undefined8 *)(puVar8 + 2) = *(undefined8 *)(lVar16 + (ulong)puVar13[2] * 8);
          puVar8[4] = puVar13[3];
          puVar8[6] = 0;
          puVar8[7] = 0;
          puVar8[8] = 0;
          puVar8[9] = puVar13[6];
          puVar8[10] = puVar13[7];
          puVar8[0xb] = puVar13[8];
          puVar13 = puVar13 + 9;
          puVar8 = puVar8 + 0xc;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      uVar4 = Stream::readU32(stream);
      (*stream->_vptr_Stream[4])(stream,local_98,(ulong)(uVar4 * 8));
      uVar15 = 0;
      do {
        psVar1 = (short *)((long)local_98 + uVar15);
        uVar15 = uVar15 + 8;
      } while (*psVar1 != 0xff);
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d9.cpp line: 84"
      ;
      pvVar9 = (void *)(*DAT_00149de8)(uVar15 & 0x7fffffff8,0x30b00);
      memcpy(pvVar9,local_98,uVar15 & 0x7fffffff8);
      *(void **)(puVar6 + 0x16) = pvVar9;
      lVar16 = 0;
      pvVar9 = d3d::createIndexBuffer(puVar6[0x18] * 2,false);
      *(void **)(puVar6 + 4) = pvVar9;
      puVar10 = d3d::lockIndices(pvVar9,0,0,0);
      (*stream->_vptr_Stream[4])(stream,puVar10,(ulong)(uint)(puVar6[0x18] * 2));
      d3d::unlockIndices(*(void **)(puVar6 + 4));
      puVar8 = puVar7;
      do {
        (*stream->_vptr_Stream[4])(stream,puVar8,0x10);
        uVar5 = *puVar8;
        *(ulong *)((long)puVar6 + lVar16 + 0x20) = (ulong)uVar5;
        *(undefined4 *)((long)puVar6 + lVar16 + 0x28) = 0;
        uVar2 = puVar8[2];
        *(uint *)((long)puVar6 + lVar16 + 0x2c) = uVar2;
        *(short *)((long)puVar6 + lVar16 + 0x30) = (short)puVar8[3];
        *(undefined1 *)((long)puVar6 + lVar16 + 0x32) = *(undefined1 *)((long)puVar8 + 0xe);
        *(undefined1 *)((long)puVar6 + lVar16 + 0x33) = *(undefined1 *)((long)puVar8 + 0xf);
        if ((ulong)uVar5 != 0) {
          pvVar9 = d3d::createVertexBuffer(uVar2 * puVar6[0x19],0,false);
          *(void **)((long)puVar6 + lVar16 + 0x20) = pvVar9;
          puVar11 = d3d::lockVertices(pvVar9,0,0,0);
          (*stream->_vptr_Stream[4])
                    (stream,puVar11,
                     (ulong)(uint)(puVar6[0x19] * *(int *)((long)puVar6 + lVar16 + 0x2c)));
          d3d::unlockVertices(*(void **)((long)puVar6 + lVar16 + 0x20));
        }
        lVar16 = lVar16 + 0x18;
        puVar8 = puVar8 + 4;
      } while (lVar16 == 0x18);
      iVar12 = puVar6[2];
      if (iVar12 != 0) {
        uVar5 = puVar6[10];
        uVar2 = puVar6[0xb];
        piVar14 = (int *)(*(long *)(puVar6 + 0x1a) + 0x20);
        do {
          *piVar14 = piVar14[-7] + uVar5 / uVar2;
          piVar14 = piVar14 + 0xc;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      (*DAT_00149de0)(puVar7);
      return stream;
    }
    readNativeData((d3d9 *)(ulong)uVar4);
  }
  else {
    readNativeData();
  }
  return (Stream *)0x0;
}

Assistant:

Stream*
readNativeData(Stream *stream, int32, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	uint32 platform;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_D3D9){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	geometry->instData = header;
	header->platform = PLATFORM_D3D9;

	int32 size = stream->readI32();
	uint8 *data = rwNewT(uint8, size, MEMDUR_FUNCTION | ID_GEOMETRY);
	stream->read8(data, size);
	uint8 *p = data;
	header->serialNumber = *(uint32*)p; p += 4;
	header->numMeshes = *(uint32*)p; p += 4;
	header->indexBuffer = nil; p += 4;
	header->primType = *(uint32*)p; p += 4;
	p += 16*2;	// skip vertex streams, they're repeated with the vertex buffers
	header->useOffsets = *(bool32*)p; p += 4;
	header->vertexDeclaration = nil; p += 4;
	header->totalNumIndex = *(uint32*)p; p += 4;
	header->totalNumVertex = *(uint32*)p; p += 4;
	header->inst = rwNewT(InstanceData, header->numMeshes, MEMDUR_EVENT | ID_GEOMETRY);

	InstanceData *inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		inst->numIndex = *(uint32*)p; p += 4;
		inst->minVert = *(uint32*)p; p += 4;
		uint32 matid = *(uint32*)p; p += 4;
		inst->material = geometry->matList.materials[matid];
		inst->vertexAlpha = *(bool32*)p; p += 4;
		inst->vertexShader = nil; p += 4;
		inst->baseIndex = 0; p += 4;
		inst->numVertices = *(uint32*)p; p += 4;
		inst->startIndex = *(uint32*)p; p += 4;
		inst->numPrimitives = *(uint32*)p; p += 4;
		inst++;
	}

	VertexElement elements[NUMDECLELT];
	uint32 numDeclarations = stream->readU32();
	stream->read8(elements, numDeclarations*8);
	header->vertexDeclaration = createVertexDeclaration(elements);

	assert(header->indexBuffer == nil);
	header->indexBuffer = createIndexBuffer(header->totalNumIndex*2, false);
	uint16 *indices = lockIndices(header->indexBuffer, 0, 0, 0);
	stream->read8(indices, 2*header->totalNumIndex);
	unlockIndices(header->indexBuffer);

	VertexStream *s;
	p = data;
	for(int i = 0; i < 2; i++){
		stream->read8(p, 16);
		s = &header->vertexStream[i];
		s->vertexBuffer = (void*)(uintptr)*(uint32*)p; p += 4;
		s->offset = 0; p += 4;
		s->stride = *(uint32*)p; p += 4;
		s->geometryFlags = *(uint16*)p; p += 2;
		s->managed = *p++;
		s->dynamicLock = *p++;

		if(s->vertexBuffer == nil)
			continue;
		// TODO: use dynamic VB when doing morphing
		assert(s->vertexBuffer == nil);
		s->vertexBuffer = createVertexBuffer(s->stride*header->totalNumVertex, 0, false);
		uint8 *verts = lockVertices(s->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
		stream->read8(verts, s->stride*header->totalNumVertex);
		unlockVertices(s->vertexBuffer);
	}

	// TODO: somehow depends on number of streams used (baseIndex = minVert when more than one)
	inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		inst->baseIndex = inst->minVert + header->vertexStream[0].offset / header->vertexStream[0].stride;
		inst++;
	}

	rwFree(data);
	return stream;
}